

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O1

Index __thiscall
wasm::ConstHoisting::getWrittenSize<wasm::LEB<int,signed_char>>
          (ConstHoisting *this,LEB<int,_signed_char> *thing)

{
  undefined1 auVar1 [8];
  pointer puVar2;
  undefined1 auStack_38 [8];
  BufferWithRandomAccess buffer;
  
  auStack_38 = (undefined1  [8])0x0;
  buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  BufferWithRandomAccess::operator<<((BufferWithRandomAccess *)auStack_38,(S32LEB)thing->value);
  puVar2 = buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar1 = auStack_38;
  if (auStack_38 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_38,
                    (long)buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_38);
  }
  return (int)puVar2 - auVar1._0_4_;
}

Assistant:

Index getWrittenSize(const T& thing) {
    BufferWithRandomAccess buffer;
    buffer << thing;
    return buffer.size();
  }